

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticParser.h
# Opt level: O2

vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> * __thiscall
pbrt::SemanticParser::extractVector<pbrt::math::vec3f>
          (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__return_storage_ptr__,
          SemanticParser *this,SP *shape,string *name)

{
  pointer __src;
  ulong __new_size;
  ulong uVar1;
  SP param;
  
  (__return_storage_ptr__->super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  syntactic::ParamSet::findParam<float>
            ((ParamSet *)&param,
             (string *)
             &(((shape->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_Node).super_ParamSet);
  if (param.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    __src = ((param.
              super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_vector<float,_std::allocator<float>_>).
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start;
    uVar1 = (long)((param.
                    super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_vector<float,_std::allocator<float>_>).
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_finish - (long)__src >> 2;
    __new_size = uVar1 / 3;
    std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize
              (__return_storage_ptr__,__new_size);
    if (2 < uVar1) {
      memmove((__return_storage_ptr__->
              super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)._M_impl.
              super__Vector_impl_data._M_start,__src,__new_size * 0xc);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&param.
              super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> extractVector(pbrt::syntactic::Shape::SP shape, const std::string &name)
    {
      std::vector<T> result;
      typename ParamArray<typename T::scalar_t>::SP param = shape->findParam<typename T::scalar_t>(name);
      if (param) {

        int dims = sizeof(T)/sizeof(typename T::scalar_t);
        size_t num = param->size() / dims;// / T::dims;
        const T *const data = (const T*)param->data();
        
        result.resize(num);
        std::copy(data,data+num,result.begin());
      }
      return result;
    }